

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  byte bVar2;
  uchar uVar3;
  uint uVar4;
  uchar *__ptr;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  uchar *puVar12;
  long in_FS_OFFSET;
  
  if (req_comp == img_n) {
    return data;
  }
  __ptr = (uchar *)stbi__malloc_mad3(req_comp,x,y,0);
  if (__ptr == (uchar *)0x0) {
    free(data);
    pcVar5 = "outofmem";
LAB_001435b8:
    *(char **)(in_FS_OFFSET + -0x30) = pcVar5;
    __ptr = (uchar *)0x0;
  }
  else {
    if (0 < (int)y) {
      uVar4 = req_comp + img_n * 8;
      if ((0x23 < uVar4) || ((0xe161a1c00U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) {
        free(data);
        free(__ptr);
        pcVar5 = "unsupported";
        goto LAB_001435b8;
      }
      iVar1 = x - 1;
      uVar10 = 0;
      uVar9 = 0;
      uVar7 = 0;
      do {
        iVar11 = (int)uVar7 * x;
        if (uVar4 - 10 < 0x19) {
          pbVar8 = data + (uint)(iVar11 * img_n);
          switch(uVar4) {
          case 10:
            if (-1 < iVar1) {
              lVar6 = 0;
              do {
                __ptr[lVar6 * 2 + uVar9] = data[lVar6 + uVar10];
                __ptr[lVar6 * 2 + uVar9 + 1] = 0xff;
                lVar6 = lVar6 + 1;
              } while (x != (uint)lVar6);
            }
            break;
          case 0xb:
            if (-1 < iVar1) {
              puVar12 = __ptr + uVar9 + 2;
              lVar6 = 0;
              do {
                uVar3 = data[lVar6 + uVar10];
                *puVar12 = uVar3;
                puVar12[-1] = uVar3;
                puVar12[-2] = uVar3;
                lVar6 = lVar6 + 1;
                puVar12 = puVar12 + 3;
              } while (x != (uint)lVar6);
            }
            break;
          case 0xc:
            if (-1 < iVar1) {
              lVar6 = 0;
              do {
                uVar3 = data[lVar6 + uVar10];
                __ptr[lVar6 * 4 + uVar9 + 2] = uVar3;
                __ptr[lVar6 * 4 + uVar9 + 1] = uVar3;
                __ptr[lVar6 * 4 + uVar9] = uVar3;
                __ptr[lVar6 * 4 + uVar9 + 3] = 0xff;
                lVar6 = lVar6 + 1;
              } while (x != (uint)lVar6);
            }
            break;
          default:
            goto switchD_001432e4_caseD_d;
          case 0x11:
            if (-1 < iVar1) {
              lVar6 = 0;
              do {
                __ptr[lVar6 + uVar9] = data[lVar6 * 2 + uVar10];
                lVar6 = lVar6 + 1;
              } while (x != (uint)lVar6);
            }
            break;
          case 0x13:
            if (-1 < iVar1) {
              puVar12 = __ptr + uVar9 + 2;
              lVar6 = 0;
              do {
                uVar3 = data[lVar6 * 2 + uVar10];
                *puVar12 = uVar3;
                puVar12[-1] = uVar3;
                puVar12[-2] = uVar3;
                lVar6 = lVar6 + 1;
                puVar12 = puVar12 + 3;
              } while (x != (uint)lVar6);
            }
            break;
          case 0x14:
            if (-1 < iVar1) {
              lVar6 = 0;
              do {
                uVar3 = data[lVar6 * 2 + uVar10];
                __ptr[lVar6 * 4 + uVar9 + 2] = uVar3;
                __ptr[lVar6 * 4 + uVar9 + 1] = uVar3;
                __ptr[lVar6 * 4 + uVar9] = uVar3;
                __ptr[lVar6 * 4 + uVar9 + 3] = data[lVar6 * 2 + uVar10 + 1];
                lVar6 = lVar6 + 1;
              } while (x != (uint)lVar6);
            }
            break;
          case 0x19:
            if (-1 < iVar1) {
              lVar6 = 0;
              do {
                bVar2 = pbVar8[2];
                __ptr[lVar6 + uVar9] =
                     (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                             (uint)pbVar8[1] * 0x96 + (uint)*pbVar8 * 0x4d >> 8);
                lVar6 = lVar6 + 1;
                pbVar8 = pbVar8 + 3;
              } while (x != (uint)lVar6);
            }
            break;
          case 0x1a:
            if (-1 < iVar1) {
              lVar6 = 0;
              do {
                bVar2 = pbVar8[2];
                __ptr[lVar6 * 2 + uVar9] =
                     (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                             (uint)pbVar8[1] * 0x96 + (uint)*pbVar8 * 0x4d >> 8);
                __ptr[lVar6 * 2 + uVar9 + 1] = 0xff;
                lVar6 = lVar6 + 1;
                pbVar8 = pbVar8 + 3;
              } while (x != (uint)lVar6);
            }
            break;
          case 0x1c:
            if (-1 < iVar1) {
              lVar6 = 0;
              do {
                __ptr[lVar6 * 4 + uVar9] = *pbVar8;
                __ptr[lVar6 * 4 + uVar9 + 1] = pbVar8[1];
                __ptr[lVar6 * 4 + uVar9 + 2] = pbVar8[2];
                __ptr[lVar6 * 4 + uVar9 + 3] = 0xff;
                lVar6 = lVar6 + 1;
                pbVar8 = pbVar8 + 3;
              } while (x != (uint)lVar6);
            }
            break;
          case 0x21:
            if (-1 < iVar1) {
              lVar6 = 0;
              do {
                bVar2 = data[lVar6 * 4 + uVar10 + 2];
                __ptr[lVar6 + uVar9] =
                     (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                             (uint)data[lVar6 * 4 + uVar10 + 1] * 0x96 +
                             (uint)data[lVar6 * 4 + uVar10] * 0x4d >> 8);
                lVar6 = lVar6 + 1;
              } while (x != (uint)lVar6);
            }
            break;
          case 0x22:
            if (-1 < iVar1) {
              lVar6 = 0;
              do {
                bVar2 = data[lVar6 * 4 + uVar10 + 2];
                __ptr[lVar6 * 2 + uVar9] =
                     (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                             (uint)data[lVar6 * 4 + uVar10 + 1] * 0x96 +
                             (uint)data[lVar6 * 4 + uVar10] * 0x4d >> 8);
                __ptr[lVar6 * 2 + uVar9 + 1] = data[lVar6 * 4 + uVar10 + 3];
                lVar6 = lVar6 + 1;
              } while (x != (uint)lVar6);
            }
          }
        }
        else {
switchD_001432e4_caseD_d:
          if (-1 < iVar1) {
            puVar12 = __ptr + (uint)(iVar11 * req_comp);
            lVar6 = 0;
            do {
              *puVar12 = data[lVar6 * 4 + uVar10];
              puVar12[1] = data[lVar6 * 4 + uVar10 + 1];
              puVar12[2] = data[lVar6 * 4 + uVar10 + 2];
              lVar6 = lVar6 + 1;
              puVar12 = puVar12 + 3;
            } while (x != (uint)lVar6);
          }
        }
        uVar7 = uVar7 + 1;
        uVar9 = (ulong)((int)uVar9 + x * req_comp);
        uVar10 = (ulong)((int)uVar10 + x * img_n);
      } while (uVar7 != y);
    }
    free(data);
  }
  return __ptr;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}